

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

bool __thiscall RenX_ServerListPlugin::initialize(RenX_ServerListPlugin *this)

{
  undefined1 *puVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  undefined1 local_80 [8];
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  content;
  undefined1 local_68 [16];
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  local_58;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  local_50;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  local_48;
  string *local_40;
  string *local_38;
  
  puVar1 = &this->field_0x38;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,8,"Hostname",0,"");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_web_hostname,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,4,"Path",1,"/");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_web_path,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0xf,"ServersPageName",7,"servers");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_server_list_page_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0x14,"HumanServersPageName",0xc,"servers_long");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_server_list_long_page_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0xe,"ServerPageName",6,"server");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_server_page_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0x10,"MetadataPageName",8,"metadata");
  local_38 = &this->m_metadata_page_name;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)local_38,(basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0x1a,"MetadataPrometheusPageName",0x13,"metadata_prometheus");
  local_40 = &this->m_metadata_prometheus_page_name;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)local_40,(basic_string_view<char,_std::char_traits<char>_> *)&content);
  uVar3 = getHTTPServer();
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&content,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_server_list_page_name);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x1155bc;
  *(string_view *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) =
       CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x1155d0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  *(undefined1 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 8) = 0;
  local_48 = (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              )(unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                )content._M_t.
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&local_48);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_server_list_long_page_name);
  auVar2 = local_80;
  local_80 = (undefined1  [8])0x0;
  std::
  __uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ::reset((__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           *)&content,(pointer)auVar2);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_80);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x1155bc;
  *(string_view *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) =
       CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x1155d0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  *(undefined1 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 8) = 1;
  local_50 = (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              )(unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                )content._M_t.
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&local_50);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->m_server_page_name);
  auVar2 = local_80;
  local_80 = (undefined1  [8])0x0;
  std::
  __uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ::reset((__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           *)&content,(pointer)auVar2);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_80);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x1155bc;
  *(string_view *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) =
       CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x1155d0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  *(undefined1 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 8) = 1;
  local_58 = (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              )(unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                )content._M_t.
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&local_58);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)local_38);
  auVar2 = local_80;
  local_80 = (undefined1  [8])0x0;
  std::
  __uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ::reset((__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           *)&content,(pointer)auVar2);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_80);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x1155bc;
  *(string_view *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) =
       CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x1155d0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  *(undefined1 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 8) = 0;
  local_68._8_8_ =
       content._M_t.
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       ._M_t.
       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)(local_68 + 8));
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)local_40);
  auVar2 = local_80;
  local_80 = (undefined1  [8])0x0;
  std::
  __uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ::reset((__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           *)&content,(pointer)auVar2);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_80);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x1155bc;
  *(string_view *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) =
       CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x1155d0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  *(undefined1 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 8) = 0;
  local_68._0_8_ =
       content._M_t.
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       ._M_t.
       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_68);
  updateServerList(this);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&content);
  return true;
}

Assistant:

bool RenX_ServerListPlugin::initialize() {
	m_web_hostname = this->config.get("Hostname"sv, ""sv);
	m_web_path = this->config.get("Path"sv, "/"sv);
	m_server_list_page_name = this->config.get("ServersPageName"sv, "servers"sv);
	m_server_list_long_page_name = this->config.get("HumanServersPageName"sv, "servers_long"sv);
	m_server_page_name = this->config.get("ServerPageName"sv, "server"sv);
	m_metadata_page_name = this->config.get("MetadataPageName"sv, "metadata"sv);
	m_metadata_prometheus_page_name = this->config.get("MetadataPrometheusPageName"sv, "metadata_prometheus"sv);

	/** Initialize content */
	Jupiter::HTTP::Server &server = getHTTPServer();

	// Server list page
	std::unique_ptr<Jupiter::HTTP::Server::Content> content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_list_page_name, handle_server_list_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Server list (long) page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_list_long_page_name, handle_server_list_long_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = true;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Server page (GUIDs)
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_page_name, handle_server_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = true;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Metadata page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_metadata_page_name, handle_metadata_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Metadata page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_metadata_prometheus_page_name, handle_metadata_prometheus_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	this->updateServerList();
	return true;
}